

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall slang::IntervalMapDetails::Path::legalizeForInsert(Path *this,uint32_t level)

{
  bool bVar1;
  reference pEVar2;
  uint in_ESI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  Path *unaff_retaddr;
  uint32_t in_stack_0000003c;
  Path *in_stack_00000040;
  
  bVar1 = valid(unaff_retaddr);
  if (!bVar1) {
    moveLeft(in_stack_00000040,in_stack_0000003c);
    pEVar2 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                       (in_RDI,(ulong)in_ESI);
    pEVar2->offset = pEVar2->offset + 1;
  }
  return;
}

Assistant:

void legalizeForInsert(uint32_t level) {
        if (valid())
            return;

        moveLeft(level);
        ++path[level].offset;
    }